

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

size_type __thiscall
bk_lib::
pod_vector<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>_*,_std::allocator<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>_*>_>
::grow_size(pod_vector<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>_*,_std::allocator<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>_*>_>
            *this,size_type n)

{
  size_type sVar1;
  uint uVar2;
  int in_ESI;
  pod_vector<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>_*,_std::allocator<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>_*>_>
  *in_RDI;
  size_type x;
  size_type new_cap;
  undefined4 local_10;
  
  sVar1 = size(in_RDI);
  local_10 = sVar1 + in_ESI;
  if (local_10 < 4) {
    local_10 = 1 << ((char)local_10 + 1U & 0x1f);
  }
  sVar1 = capacity(in_RDI);
  uVar2 = sVar1 * 3 >> 1;
  if (local_10 < uVar2) {
    local_10 = uVar2;
  }
  return local_10;
}

Assistant:

size_type grow_size(size_type n) {
		size_type new_cap = size() + n;
		assert(new_cap > size() && "pod_vector: max size exceeded!");
		assert(new_cap > capacity());
		if (new_cap < 4) new_cap = 1 << (new_cap+1);
		size_type x = (capacity()*3)>>1;
		if (new_cap < x) new_cap = x;
		return new_cap;
	}